

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_1::MapBufferRangeCase::testBufferUpload
          (MapBufferRangeCase *this,
          UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
          *result,int bufferSize)

{
  TestError *this_00;
  allocator<char> local_59;
  string local_58;
  UnmapFailureError *anon_var_0;
  undefined4 local_20;
  int local_1c;
  int unmapFailureThreshold;
  int bufferSize_local;
  UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
  *result_local;
  MapBufferRangeCase *this_local;
  
  local_20 = 4;
  local_1c = bufferSize;
  _unmapFailureThreshold = result;
  result_local = (UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
                  *)this;
  if (this->m_unmapFailures < 4) {
    attemptBufferMap(this,result,bufferSize);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Unmapping failures exceeded limit",&local_59);
  tcu::TestError::TestError(this_00,&local_58);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void MapBufferRangeCase::testBufferUpload (UploadSampleResult<MapBufferRangeDuration>& result, int bufferSize)
{
	const int unmapFailureThreshold = 4;

	for (; m_unmapFailures < unmapFailureThreshold; ++m_unmapFailures)
	{
		try
		{
			attemptBufferMap(result, bufferSize);
			return;
		}
		catch (UnmapFailureError&)
		{
		}
	}

	throw tcu::TestError("Unmapping failures exceeded limit");
}